

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilReader.c
# Opt level: O1

void Extra_FileReaderFree(Extra_FileReader_t *p)

{
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  
  if ((FILE *)p->pFile != (FILE *)0x0) {
    fclose((FILE *)p->pFile);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  __ptr = p->vTokens;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  __ptr_00 = p->vLines;
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  if (p != (Extra_FileReader_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Extra_FileReaderFree( Extra_FileReader_t * p )
{
    if ( p->pFile )
        fclose( p->pFile );
    ABC_FREE( p->pBuffer );
    Vec_PtrFree( p->vTokens );
    Vec_IntFree( p->vLines );
    ABC_FREE( p );
}